

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O2

void __thiscall
proto2_unittest::TestOneof2::set_foo_enum(TestOneof2 *this,TestOneof2_NestedEnum value)

{
  bool bVar1;
  
  bVar1 = google::protobuf::internal::ValidateEnum
                    (value,(uint32_t *)&TestOneof2_NestedEnum_internal_data_);
  if (bVar1) {
    if ((this->field_0)._impl_._oneof_case_[0] != 6) {
      clear_foo(this);
      (this->field_0)._impl_._oneof_case_[0] = 6;
    }
    *(TestOneof2_NestedEnum *)((long)&this->field_0 + 0x18) = value;
    return;
  }
  __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest::TestOneof2_NestedEnum_internal_data_)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest.pb.h"
                ,0xf6a3,
                "void proto2_unittest::TestOneof2::set_foo_enum(::proto2_unittest::TestOneof2_NestedEnum)"
               );
}

Assistant:

inline void TestOneof2::set_foo_enum(::proto2_unittest::TestOneof2_NestedEnum value) {

                                          assert(::google::protobuf::internal::ValidateEnum(
                                              value, ::proto2_unittest::TestOneof2_NestedEnum_internal_data_));
                                          if (foo_case() != kFooEnum) {
    clear_foo();
    set_has_foo_enum();
  }
  _impl_.foo_.foo_enum_ = value;
  // @@protoc_insertion_point(field_set:proto2_unittest.TestOneof2.foo_enum)
}